

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5StructureExtendLevel(int *pRc,Fts5Structure *pStruct,int iLvl,int nExtra,int bInsert)

{
  long lVar1;
  void *__src;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  int *in_RDI;
  int in_R8D;
  int nMove;
  sqlite3_int64 nByte;
  Fts5StructureSegment *aNew;
  Fts5StructureLevel *pLvl;
  void *in_stack_ffffffffffffffb8;
  
  if (*in_RDI == 0) {
    lVar1 = in_RSI + 0x20 + (long)in_EDX * 0x10;
    __src = sqlite3_realloc64(in_stack_ffffffffffffffb8,0x279aab);
    if (__src == (void *)0x0) {
      *in_RDI = 7;
    }
    else {
      if (in_R8D == 0) {
        memset((void *)((long)__src + (long)*(int *)(lVar1 + 4) * 0x38),0,(long)in_ECX * 0x38);
      }
      else {
        memmove((void *)((long)__src + (long)in_ECX * 0x38),__src,(long)(*(int *)(lVar1 + 4) * 0x38)
               );
        memset(__src,0,(long)in_ECX * 0x38);
      }
      *(void **)(lVar1 + 8) = __src;
    }
  }
  return;
}

Assistant:

static void fts5StructureExtendLevel(
  int *pRc,
  Fts5Structure *pStruct,
  int iLvl,
  int nExtra,
  int bInsert
){
  if( *pRc==SQLITE_OK ){
    Fts5StructureLevel *pLvl = &pStruct->aLevel[iLvl];
    Fts5StructureSegment *aNew;
    sqlite3_int64 nByte;

    nByte = (pLvl->nSeg + nExtra) * sizeof(Fts5StructureSegment);
    aNew = sqlite3_realloc64(pLvl->aSeg, nByte);
    if( aNew ){
      if( bInsert==0 ){
        memset(&aNew[pLvl->nSeg], 0, sizeof(Fts5StructureSegment) * nExtra);
      }else{
        int nMove = pLvl->nSeg * sizeof(Fts5StructureSegment);
        memmove(&aNew[nExtra], aNew, nMove);
        memset(aNew, 0, sizeof(Fts5StructureSegment) * nExtra);
      }
      pLvl->aSeg = aNew;
    }else{
      *pRc = SQLITE_NOMEM;
    }
  }
}